

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_path.c
# Opt level: O1

void sys_setextrapath(char *p)

{
  t_namelist *ptVar1;
  int bufsize;
  int bufsize_00;
  char pathbuf [1000];
  char acStack_408 [1008];
  
  namelist_free((pd_maininstance.pd_stuff)->st_staticpath);
  sys_expandpath("~/.local/lib/pd/extra/",acStack_408,bufsize);
  ptVar1 = namelist_append((t_namelist *)0x0,acStack_408,0);
  (pd_maininstance.pd_stuff)->st_staticpath = ptVar1;
  sys_expandpath("~/pd-externals",acStack_408,bufsize_00);
  ptVar1 = namelist_append((pd_maininstance.pd_stuff)->st_staticpath,acStack_408,0);
  (pd_maininstance.pd_stuff)->st_staticpath = ptVar1;
  ptVar1 = namelist_append(ptVar1,"/usr/local/lib/pd-externals",0);
  (pd_maininstance.pd_stuff)->st_staticpath = ptVar1;
  ptVar1 = namelist_append(ptVar1,p,0);
  (pd_maininstance.pd_stuff)->st_staticpath = ptVar1;
  return;
}

Assistant:

void sys_setextrapath(const char *p)
{
    char pathbuf[MAXPDSTRING];
    namelist_free(STUFF->st_staticpath);
    /* add standard place for users to install stuff first */
#ifdef __gnu_linux__
    sys_expandpath("~/.local/lib/pd/extra/", pathbuf, MAXPDSTRING);
    STUFF->st_staticpath = namelist_append(0, pathbuf, 0);
    sys_expandpath("~/pd-externals", pathbuf, MAXPDSTRING);
    STUFF->st_staticpath = namelist_append(STUFF->st_staticpath, pathbuf, 0);
    STUFF->st_staticpath = namelist_append(STUFF->st_staticpath,
        "/usr/local/lib/pd-externals", 0);
#endif

#ifdef __APPLE__
    sys_expandpath("~/Library/Pd", pathbuf, MAXPDSTRING);
    STUFF->st_staticpath = namelist_append(0, pathbuf, 0);
    STUFF->st_staticpath = namelist_append(STUFF->st_staticpath, "/Library/Pd", 0);
#endif

#ifdef _WIN32
    sys_expandpath("%AppData%/Pd", pathbuf, MAXPDSTRING);
    STUFF->st_staticpath = namelist_append(0, pathbuf, 0);
    sys_expandpath("%CommonProgramFiles%/Pd", pathbuf, MAXPDSTRING);
    STUFF->st_staticpath = namelist_append(STUFF->st_staticpath, pathbuf, 0);
#endif
    /* add built-in "extra" path last so its checked last */
    STUFF->st_staticpath = namelist_append(STUFF->st_staticpath, p, 0);
}